

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O0

matrix<double> * __thiscall
mat_lib::matrix<double>::inverse(matrix<double> *__return_storage_ptr__,matrix<double> *this)

{
  double dVar1;
  double dVar2;
  element_t eVar3;
  undefined8 uVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  int iVar9;
  size_t sVar10;
  size_t sVar11;
  logic_error *this_00;
  ulong uVar12;
  void *pvVar13;
  void *pvVar14;
  element_t *peVar15;
  int local_84;
  int local_80;
  int j_5;
  int i_7;
  int j_4;
  int i_6;
  int k;
  int j_3;
  int i_5;
  double *temp_1;
  int local_58;
  int i_4;
  int j_2;
  int i_3;
  double temp;
  int local_40;
  int j_1;
  int i_2;
  int j;
  int i_1;
  int i;
  double **matrix_elements;
  int order;
  matrix<double> *this_local;
  matrix<double> *inverse_matrix;
  
  sVar10 = rows(this);
  sVar11 = columns(this);
  if (sVar10 == sVar11) {
    sVar10 = rows(this);
    sVar11 = columns(this);
    if (1 < sVar10 * sVar11) {
      sVar10 = rows(this);
      iVar9 = (int)sVar10;
      sVar10 = size(this);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = sVar10 + 2;
      uVar12 = SUB168(auVar6 * ZEXT816(8),0);
      if (SUB168(auVar6 * ZEXT816(8),8) != 0) {
        uVar12 = 0xffffffffffffffff;
      }
      pvVar13 = operator_new__(uVar12);
      for (j = 0; sVar10 = size(this), (ulong)(long)j < sVar10; j = j + 1) {
        sVar10 = size(this);
        auVar7._8_8_ = 0;
        auVar7._0_8_ = sVar10 + 2;
        uVar12 = SUB168(auVar7 * ZEXT816(8),0);
        if (SUB168(auVar7 * ZEXT816(8),8) != 0) {
          uVar12 = 0xffffffffffffffff;
        }
        pvVar14 = operator_new__(uVar12);
        *(void **)((long)pvVar13 + (long)j * 8) = pvVar14;
      }
      for (i_2 = 0; sVar10 = rows(this), (ulong)(long)i_2 < sVar10; i_2 = i_2 + 1) {
        for (j_1 = 0; sVar10 = columns(this), (ulong)(long)j_1 < sVar10 << 1; j_1 = j_1 + 1) {
          *(undefined8 *)(*(long *)((long)pvVar13 + (long)i_2 * 8) + (long)j_1 * 8) = 0;
        }
      }
      for (local_40 = 0; sVar10 = rows(this), (ulong)(long)local_40 < sVar10;
          local_40 = local_40 + 1) {
        for (temp._4_4_ = 0; sVar10 = columns(this), (ulong)(long)temp._4_4_ < sVar10;
            temp._4_4_ = temp._4_4_ + 1) {
          peVar15 = this->elements__;
          sVar10 = offset__(this,(long)local_40,temp._4_4_);
          *(element_t *)(*(long *)((long)pvVar13 + (long)local_40 * 8) + (long)temp._4_4_ * 8) =
               peVar15[sVar10];
        }
      }
      sVar10 = rows(this);
      sVar11 = columns(this);
      matrix(__return_storage_ptr__,sVar10,sVar11);
      for (i_4 = 0; temp_1._4_4_ = iVar9, i_4 < iVar9; i_4 = i_4 + 1) {
        for (local_58 = 0; SBORROW4(local_58,iVar9 * 2) != local_58 + iVar9 * -2 < 0;
            local_58 = local_58 + 1) {
          if (local_58 == i_4 + iVar9) {
            *(undefined8 *)(*(long *)((long)pvVar13 + (long)i_4 * 8) + (long)local_58 * 8) =
                 0x3ff0000000000000;
          }
        }
      }
      while (iVar8 = temp_1._4_4_, temp_1._4_4_ = iVar8 + -1, 0 < temp_1._4_4_) {
        if (**(double **)((long)pvVar13 + (long)(iVar8 + -2) * 8) <
            **(double **)((long)pvVar13 + (long)temp_1._4_4_ * 8)) {
          uVar4 = *(undefined8 *)((long)pvVar13 + (long)temp_1._4_4_ * 8);
          *(undefined8 *)((long)pvVar13 + (long)temp_1._4_4_ * 8) =
               *(undefined8 *)((long)pvVar13 + (long)(iVar8 + -2) * 8);
          *(undefined8 *)((long)pvVar13 + (long)(iVar8 + -2) * 8) = uVar4;
        }
      }
      for (k = 0; k < iVar9; k = k + 1) {
        for (i_6 = 0; i_6 < iVar9; i_6 = i_6 + 1) {
          if (i_6 != k) {
            dVar1 = *(double *)(*(long *)((long)pvVar13 + (long)i_6 * 8) + (long)k * 8);
            dVar2 = *(double *)(*(long *)((long)pvVar13 + (long)k * 8) + (long)k * 8);
            for (j_4 = 0; SBORROW4(j_4,iVar9 * 2) != j_4 + iVar9 * -2 < 0; j_4 = j_4 + 1) {
              lVar5 = *(long *)((long)pvVar13 + (long)i_6 * 8);
              *(double *)(lVar5 + (long)j_4 * 8) =
                   -*(double *)(*(long *)((long)pvVar13 + (long)k * 8) + (long)j_4 * 8) *
                   (dVar1 / dVar2) + *(double *)(lVar5 + (long)j_4 * 8);
            }
          }
        }
      }
      for (i_7 = 0; i_7 < iVar9; i_7 = i_7 + 1) {
        dVar1 = *(double *)(*(long *)((long)pvVar13 + (long)i_7 * 8) + (long)i_7 * 8);
        for (j_5 = 0; SBORROW4(j_5,iVar9 * 2) != j_5 + iVar9 * -2 < 0; j_5 = j_5 + 1) {
          *(double *)(*(long *)((long)pvVar13 + (long)i_7 * 8) + (long)j_5 * 8) =
               *(double *)(*(long *)((long)pvVar13 + (long)i_7 * 8) + (long)j_5 * 8) / dVar1;
        }
      }
      for (local_80 = 0; local_84 = iVar9, local_80 < iVar9; local_80 = local_80 + 1) {
        for (; SBORROW4(local_84,iVar9 * 2) != local_84 + iVar9 * -2 < 0; local_84 = local_84 + 1) {
          eVar3 = *(element_t *)(*(long *)((long)pvVar13 + (long)local_80 * 8) + (long)local_84 * 8)
          ;
          peVar15 = operator[](__return_storage_ptr__,(long)local_80);
          peVar15[local_84 - iVar9] = eVar3;
        }
      }
      if (pvVar13 != (void *)0x0) {
        operator_delete__(pvVar13);
      }
      return __return_storage_ptr__;
    }
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error
            (this_00,
             "Inverse operation not possible, the elementsPointer need be square and the order grater than one"
            );
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

matrix<T> matrix<T>::inverse() {
        if(rows() != columns() || rows()*columns() <= 1)
            throw logic_error("Inverse operation not possible, "
                              "the elementsPointer need be square and the order grater than one");

        int order = rows();

        // Copy the elements
        T** matrix_elements = new T*[this->size() + 2];

        for(int i = 0; i < this->size(); i++)
            matrix_elements[i] = new double[this->size() + 2];

        for(int i = 0; i < rows(); i++)
            for(int j = 0; j < 2 * columns(); j++)
                matrix_elements[i][j] = 0;

        for(int i = 0; i < rows(); i++)
            for(int j = 0; j < columns(); j++)
                matrix_elements[i][j] = elements__[offset__(i,j)];

        // create the inverse matrix
        matrix<T> inverse_matrix (rows(), columns());

        double temp;

        for(int i = 0; i < order; i++) {
            for (int j = 0; j < 2 * order; j++) {
                if (j == (i + order)) {
                    matrix_elements[i][j] = 1;

                }
            }
        }

        for(int i = order -1; i > 0; i--) {
            if (matrix_elements[i - 1][0] < matrix_elements[i][0]) {
                double* temp = matrix_elements[i];
                matrix_elements[i] = matrix_elements[i - 1];
                matrix_elements[i - 1] = temp;
            }
        }


        for (int i = 0; i < order; i++) {
            for (int j = 0; j < order; j++) {
                if (j != i) {
                    temp = matrix_elements[j][i] / matrix_elements[i][i];
                    for(int k = 0; k < 2 * order; k++)
                        matrix_elements[j][k] -= matrix_elements[i][k] * temp;

                }
            }
        }

        for(int i = 0; i < order; i++) {
            temp = matrix_elements[i][i];
            for(int j = 0; j < 2 * order; j++) {
                matrix_elements[i][j] = matrix_elements[i][j] / temp;

            }
        }

        for(int i = 0; i < order; i++)
            for(int j = order; j < 2*order; j++) {
                inverse_matrix[i][j - order] = matrix_elements[i][j];
            }



        delete [] matrix_elements;

        return inverse_matrix;
    }